

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall bssl::anon_unknown_0::SSLTest_SetBIO_Test::TestBody(SSLTest_SetBIO_Test *this)

{
  SSL_METHOD *meth;
  BIO_METHOD *pBVar1;
  char *in_R9;
  UniquePtr<BIO> bio1;
  UniquePtr<SSL> ssl;
  AssertHelper local_68;
  Message local_60;
  UniquePtr<BIO> bio3;
  UniquePtr<BIO> bio2;
  string local_48;
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  
  meth = (SSL_METHOD *)TLS_method();
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&ssl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)0x2f5309,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bio1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd6b,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bio1,(Message *)&ssl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bio1);
    std::__cxx11::string::~string((string *)&local_48);
    if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
        ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00171b81;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 SSL_new((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  pBVar1 = BIO_s_mem();
  bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(pBVar1);
  pBVar1 = BIO_s_mem();
  bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(pBVar1);
  pBVar1 = BIO_s_mem();
  bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(pBVar1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
       ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
      ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)0x301297,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd70,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
LAB_00171b2f:
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_60.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
         bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
        bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message(&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"bio1","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd71,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_68,&local_60);
      goto LAB_00171b2f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
         bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
        bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message(&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"bio2","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd72,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_68,&local_60);
      goto LAB_00171b2f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
         bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
        bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message(&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"bio3","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd73,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_68,&local_60);
      goto LAB_00171b2f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    BIO_up_ref((BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio3._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    BIO_up_ref((BIO *)bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    SSL_set_bio((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                (BIO *)bio2._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                (BIO *)bio1._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio3);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio2);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio1);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl);
LAB_00171b81:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(SSLTest, SetBIO) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  bssl::UniquePtr<BIO> bio1(BIO_new(BIO_s_mem())), bio2(BIO_new(BIO_s_mem())),
      bio3(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(ssl);
  ASSERT_TRUE(bio1);
  ASSERT_TRUE(bio2);
  ASSERT_TRUE(bio3);

  // SSL_set_bio takes one reference when the parameters are the same.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // Repeating the call does nothing.
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // It takes one reference each when the parameters are different.
  BIO_up_ref(bio2.get());
  BIO_up_ref(bio3.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio3.get());

  // Repeating the call does nothing.
  SSL_set_bio(ssl.get(), bio2.get(), bio3.get());

  // It takes one reference when changing only wbio.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio1.get());

  // It takes one reference when changing only rbio and the two are different.
  BIO_up_ref(bio3.get());
  SSL_set_bio(ssl.get(), bio3.get(), bio1.get());

  // If setting wbio to rbio, it takes no additional references.
  SSL_set_bio(ssl.get(), bio3.get(), bio3.get());

  // From there, wbio may be switched to something else.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio3.get(), bio1.get());

  // If setting rbio to wbio, it takes no additional references.
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // From there, rbio may be switched to something else, but, for historical
  // reasons, it takes a reference to both parameters.
  BIO_up_ref(bio1.get());
  BIO_up_ref(bio2.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio1.get());

  // ASAN builds will implicitly test that the internal |BIO| reference-counting
  // is correct.
}